

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_func.cpp
# Opt level: O1

bool __thiscall DBot::Reachable(DBot *this,AActor *rtarget)

{
  APlayerPawn *pAVar1;
  sector_t *psVar2;
  line_t_conflict *plVar3;
  byte bVar4;
  bool bVar5;
  intercept_t *piVar6;
  byte unaff_BPL;
  byte bVar7;
  bool bVar8;
  sector_t_conflict *sec;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  FPathTraverse it;
  double local_a0;
  sector_t_conflict *local_98;
  FPathTraverse local_70;
  
  pAVar1 = this->player->mo;
  if ((pAVar1 == (APlayerPawn *)rtarget) ||
     (psVar2 = rtarget->Sector, dVar9 = (rtarget->__Pos).X, dVar11 = (rtarget->__Pos).Y,
     ((psVar2->ceilingplane).normal.Y * dVar11 +
     (psVar2->ceilingplane).normal.X * dVar9 + (psVar2->ceilingplane).D) *
     (psVar2->ceilingplane).negiC -
     (dVar11 * (psVar2->floorplane).normal.Y +
     dVar9 * (psVar2->floorplane).normal.X + (psVar2->floorplane).D) * (psVar2->floorplane).negiC <
     (pAVar1->super_AActor).Height)) {
    bVar7 = 0;
  }
  else {
    local_98 = (sector_t_conflict *)(pAVar1->super_AActor).Sector;
    local_a0 = ((local_98->floorplane).normal.Y * (pAVar1->super_AActor).__Pos.Y +
               (local_98->floorplane).normal.X * (pAVar1->super_AActor).__Pos.X +
               (local_98->floorplane).D) * (local_98->floorplane).negiC;
    dVar9 = AActor::Distance2D(&pAVar1->super_AActor,rtarget,false);
    local_70._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_006fe0c8;
    FPathTraverse::init(&local_70,(EVP_PKEY_CTX *)0x3);
    bVar4 = 1;
    do {
      bVar7 = bVar4;
      piVar6 = FPathTraverse::Next(&local_70);
      if (piVar6 == (intercept_t *)0x0) break;
      dVar11 = piVar6->frac + -0.00262144;
      pAVar1 = this->player->mo;
      bVar4 = bVar7;
      if (piVar6->isaline == true) {
        plVar3 = (piVar6->d).line;
        bVar8 = true;
        if ((plVar3->flags & 0xc005) == 4) {
          sec = plVar3->backsector;
          if (sec == local_98) {
            sec = plVar3->frontsector;
          }
          dVar10 = (pAVar1->super_AActor).Vel.X * dVar11 + local_70.trace.x;
          dVar11 = dVar11 * (pAVar1->super_AActor).Vel.Y + local_70.trace.y;
          dVar12 = ((sec->ceilingplane).normal.Y * dVar11 +
                   (sec->ceilingplane).normal.X * dVar10 + (sec->ceilingplane).D) *
                   (sec->ceilingplane).negiC;
          dVar11 = (dVar11 * (sec->floorplane).normal.Y +
                   dVar10 * (sec->floorplane).normal.X + (sec->floorplane).D) *
                   (sec->floorplane).negiC;
          bVar5 = FCajunMaster::IsDangerous(&bglobal,(sector_t *)sec);
          if ((bVar5 || local_a0 + 32.0 < dVar11) ||
             ((((dVar12 != dVar11 || (NAN(dVar12) || NAN(dVar11))) || (plVar3->special == 0)) &&
              (dVar12 - dVar11 < (this->player->mo->super_AActor).Height)))) {
            unaff_BPL = 0;
          }
          else {
            bVar8 = false;
            local_a0 = dVar11;
            local_98 = sec;
          }
        }
        else {
          unaff_BPL = 0;
        }
      }
      else {
        bVar8 = true;
        if (dVar11 * 1525.87890625 <= dVar9) {
          if ((APlayerPawn *)(piVar6->d).thing == pAVar1) {
            bVar8 = false;
          }
          else {
            if (((APlayerPawn *)(piVar6->d).thing == (APlayerPawn *)rtarget) &&
               (psVar2 = rtarget->Sector,
               ((psVar2->floorplane).normal.Y * (rtarget->__Pos).Y +
               (psVar2->floorplane).normal.X * (rtarget->__Pos).X + (psVar2->floorplane).D) *
               (psVar2->floorplane).negiC <= local_a0 + 32.0)) goto LAB_0034950a;
            bVar8 = false;
            bVar4 = 0;
          }
        }
        else {
LAB_0034950a:
          unaff_BPL = 1;
        }
      }
      bVar7 = unaff_BPL;
      unaff_BPL = bVar7;
    } while (!bVar8);
    FPathTraverse::~FPathTraverse(&local_70);
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool DBot::Reachable (AActor *rtarget)
{
	if (player->mo == rtarget)
		return false;

	if ((rtarget->Sector->ceilingplane.ZatPoint (rtarget) -
		 rtarget->Sector->floorplane.ZatPoint (rtarget))
		< player->mo->Height) //Where rtarget is, player->mo can't be.
		return false;

	sector_t *last_s = player->mo->Sector;
	double last_z = last_s->floorplane.ZatPoint (player->mo);
	double estimated_dist = player->mo->Distance2D(rtarget);
	bool reachable = true;

	FPathTraverse it(player->mo->X()+player->mo->Vel.X, player->mo->Y()+player->mo->Vel.Y, rtarget->X(), rtarget->Y(), PT_ADDLINES|PT_ADDTHINGS);
	intercept_t *in;
	while ((in = it.Next()))
	{
		double hitx, hity;
		double frac;
		line_t *line;
		AActor *thing;
		double dist;
		sector_t *s;

		frac = in->frac - 4 /MAX_TRAVERSE_DIST;
		dist = frac * MAX_TRAVERSE_DIST;

		hitx = it.Trace().x + player->mo->Vel.X * frac;
		hity = it.Trace().y + player->mo->Vel.Y * frac;

		if (in->isaline)
		{
			line = in->d.line;

			if (!(line->flags & ML_TWOSIDED) || (line->flags & (ML_BLOCKING|ML_BLOCKEVERYTHING|ML_BLOCK_PLAYERS)))
			{
				return false; //Cannot continue.
			}
			else
			{
				//Determine if going to use backsector/frontsector.
				s = (line->backsector == last_s) ? line->frontsector : line->backsector;
				double ceilingheight = s->ceilingplane.ZatPoint (hitx, hity);
				double floorheight = s->floorplane.ZatPoint (hitx, hity);

				if (!bglobal.IsDangerous (s) &&		//Any nukage/lava?
					(floorheight <= (last_z+MAXMOVEHEIGHT)
					&& ((ceilingheight == floorheight && line->special)
						|| (ceilingheight - floorheight) >= player->mo->Height))) //Does it fit?
				{
					last_z = floorheight;
					last_s = s;
					continue;
				}
				else
				{
					return false;
				}
			}
		}

		if (dist > estimated_dist)
		{
			return true;
		}

		thing = in->d.thing;
		if (thing == player->mo) //Can't reach self in this case.
			continue;
		if (thing == rtarget && (rtarget->Sector->floorplane.ZatPoint (rtarget) <= (last_z+MAXMOVEHEIGHT)))
		{
			return true;
		}

		reachable = false;
	}
	return reachable;
}